

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-arith-cwise.cc
# Opt level: O2

int __thiscall
dynet::CwiseMultiply::autobatch_sig(CwiseMultiply *this,ComputationGraph *cg,SigMap *sm)

{
  uint *puVar1;
  pointer ppNVar2;
  bool bVar3;
  int iVar4;
  Sig s;
  SigHash local_10;
  
  local_10.hash = -0x3361d2be;
  local_10.which = 0x13;
  puVar1 = (this->super_Node).args.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ppNVar2 = (cg->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar3 = operator==(&ppNVar2[*puVar1]->dim,&ppNVar2[puVar1[1]]->dim);
  iVar4 = 0;
  if (bVar3) {
    iVar4 = SigLinearSortedMap<dynet::SigHash>::get_idx(sm,&local_10);
  }
  return iVar4;
}

Assistant:

int CwiseMultiply::autobatch_sig(const ComputationGraph & cg, SigMap &sm) const {
  // TODO: This does not handle the case where dimensions differ
  Sig s(nt::cmult);
  return cg.nodes[args[0]]->dim == cg.nodes[args[1]]->dim ? sm.get_idx(s) : 0;
}